

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asset-resolution.cc
# Opt level: O2

bool __thiscall
tinyusdz::AssetResolutionResolver::find(AssetResolutionResolver *this,string *assetPath)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  void *pvVar1;
  undefined8 uVar2;
  int iVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  bool bVar6;
  string err;
  string fpath;
  string ext;
  uint64_t sz;
  undefined1 local_a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string local_68;
  uint64_t local_48 [3];
  
  io::GetFileExtension(&local_68,(string *)assetPath);
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
             *)(this + 0x48);
  sVar4 = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
          ::count(this_00,&local_68);
  if (((sVar4 == 0) ||
      (pmVar5 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                ::at(this_00,&local_68), pmVar5->resolve_fun == (FSResolveAsset)0x0)) ||
     (pmVar5 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
               ::at(this_00,&local_68), pmVar5->size_fun == (FSSizeAsset)0x0)) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 8);
    bVar6 = ::std::operator==(__lhs,".");
    if ((bVar6) || (bVar6 = ::std::operator==(__lhs,"./"), bVar6)) {
      local_a8._0_8_ = (pointer)0x0;
      local_a8._8_8_ = (pointer)0x0;
      local_a8._16_8_ = (pointer)0x0;
      io::FindFile((string *)&local_88,(string *)assetPath,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_a8);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8);
      ::std::__cxx11::string::_M_dispose();
    }
    else {
      ::std::__cxx11::string::string((string *)local_a8,(string *)__lhs);
      local_48[0] = 0;
      local_48[1] = 0;
      local_48[2] = 0;
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_48,
                 local_a8,&local_88);
      io::FindFile((string *)&local_88,(string *)assetPath,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_48);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_48);
      ::std::__cxx11::string::_M_dispose();
      uVar2 = local_88._8_8_;
      ::std::__cxx11::string::_M_dispose();
      bVar6 = true;
      if (uVar2 != 0) goto LAB_00275734;
    }
    io::FindFile((string *)&local_88,(string *)assetPath,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(this + 0x28));
    bVar6 = local_88._8_8_ != 0;
  }
  else {
    local_88._M_allocated_capacity = (size_type)&local_78;
    local_88._8_8_ = 0;
    bVar6 = false;
    local_78._M_local_buf[0] = '\0';
    local_a8._0_8_ = local_a8 + 0x10;
    local_a8._8_8_ = (pointer)0x0;
    local_a8._16_8_ = local_a8._16_8_ & 0xffffffffffffff00;
    pmVar5 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
             ::at(this_00,&local_68);
    pvVar1 = pmVar5->userdata;
    pmVar5 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
             ::at(this_00,&local_68);
    iVar3 = (*pmVar5->resolve_fun)
                      ((assetPath->_M_dataplus)._M_p,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(this + 0x28),(string *)&local_88,(string *)local_a8,pvVar1);
    if (iVar3 == 0) {
      local_48[0] = 0;
      pmVar5 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
               ::at(this_00,&local_68);
      iVar3 = (*pmVar5->size_fun)((char *)local_88._M_allocated_capacity,local_48,(string *)local_a8
                                  ,pvVar1);
      bVar6 = local_48[0] != 0 && iVar3 == 0;
    }
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::string::_M_dispose();
LAB_00275734:
  ::std::__cxx11::string::_M_dispose();
  return bVar6;
}

Assistant:

bool AssetResolutionResolver::find(const std::string &assetPath) const {
  DCOUT("search_paths = " << _search_paths);
  DCOUT("assetPath = " << assetPath);

  std::string ext = io::GetFileExtension(assetPath);

  if (_asset_resolution_handlers.count(ext)) {
    if (_asset_resolution_handlers.at(ext).resolve_fun && _asset_resolution_handlers.at(ext).size_fun) {
      std::string resolvedPath;
      std::string err;

      // Use custom handler's userdata
      void *userdata = _asset_resolution_handlers.at(ext).userdata;

      int ret = _asset_resolution_handlers.at(ext).resolve_fun(assetPath.c_str(), _search_paths, &resolvedPath, &err, userdata);
      if (ret != 0) {
        return false;
      }

      uint64_t sz{0};
      ret = _asset_resolution_handlers.at(ext).size_fun(resolvedPath.c_str(), &sz, &err, userdata);
      if (ret != 0) {
        return false;
      }

      return sz > 0;

    } else {
      DCOUT("Either Resolve function or Size function is nullptr. Fallback to built-in file handler.");
    }
  }

  if ((_current_working_path == ".") || (_current_working_path == "./")) {
    std::string rpath = io::FindFile(assetPath, {});
  } else {
    // TODO: Only find when input path is relative.
    std::string rpath = io::FindFile(assetPath, {_current_working_path});
    if (rpath.size()) {
      return true;
    }
  }

  // TODO: Cache resolition.
  std::string fpath = io::FindFile(assetPath, _search_paths);
  return fpath.size();

}